

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

string * __thiscall
cmCTestCoverageHandler::FindFile
          (string *__return_storage_ptr__,cmCTestCoverageHandler *this,
          cmCTestCoverageHandlerContainer *cont,string *fileName)

{
  pointer pcVar1;
  bool bVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string fileNameNoE;
  size_type *local_d0;
  size_type local_c8;
  size_type local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_50,fileName);
  pcVar1 = (cont->SourceDir)._M_dataplus._M_p;
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + (cont->SourceDir)._M_string_length);
  std::__cxx11::string::append((char *)&local_b0);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)local_50._M_dataplus._M_p);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    local_c0 = *psVar5;
    lStack_b8 = plVar3[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *psVar5;
    local_d0 = (size_type *)*plVar3;
  }
  local_c8 = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  bVar2 = cmsys::SystemTools::FileExists((char *)local_d0);
  if (bVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_d0 == &local_c0) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_c0;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lStack_b8;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_d0;
LAB_002b6022:
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_c0;
    }
  }
  else {
    pcVar1 = (cont->BinaryDir)._M_dataplus._M_p;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar1,pcVar1 + (cont->BinaryDir)._M_string_length);
    std::__cxx11::string::append((char *)local_70);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_70,(ulong)local_50._M_dataplus._M_p);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_a0 = *plVar4;
      lStack_98 = plVar3[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar4;
      local_b0 = (long *)*plVar3;
    }
    local_a8 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_80 = *plVar4;
      lStack_78 = plVar3[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar4;
      local_90 = (long *)*plVar3;
    }
    local_88 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    bVar2 = cmsys::SystemTools::FileExists((char *)local_d0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (!bVar2) {
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      goto LAB_002b605b;
    }
    if (local_d0 != &local_c0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_d0;
      goto LAB_002b6022;
    }
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_c0;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lStack_b8;
  }
  __return_storage_ptr__->_M_string_length = local_c8;
  local_c8 = 0;
  local_c0 = local_c0 & 0xffffffffffffff00;
  local_d0 = &local_c0;
LAB_002b605b:
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestCoverageHandler::FindFile(
  cmCTestCoverageHandlerContainer* cont, std::string const& fileName)
{
  std::string fileNameNoE =
    cmSystemTools::GetFilenameWithoutLastExtension(fileName);
  // First check in source and binary directory
  std::string fullName = cont->SourceDir + "/" + fileNameNoE + ".py";
  if (cmSystemTools::FileExists(fullName.c_str())) {
    return fullName;
  }
  fullName = cont->BinaryDir + "/" + fileNameNoE + ".py";
  if (cmSystemTools::FileExists(fullName.c_str())) {
    return fullName;
  }
  return "";
}